

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O0

asn_enc_rval_t *
BOOLEAN_encode_xer(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
                  asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  code *in_R9;
  undefined8 in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  asn_enc_rval_t er;
  BOOLEAN_t *st;
  char *local_60;
  char *local_58;
  ssize_t local_40;
  
  if (in_RDX == (int *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = (void *)0x0;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_58 = "";
    }
    else {
      local_58 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_58);
    return in_RDI;
  }
  if (*in_RDX == 0) {
    iVar1 = (*in_R9)("<false/>",8,in_stack_00000008);
    if (-1 < iVar1) {
      local_40 = 8;
      goto LAB_0014e84e;
    }
  }
  else {
    iVar1 = (*in_R9)("<true/>",7,in_stack_00000008);
    if (-1 < iVar1) {
      local_40 = 7;
LAB_0014e84e:
      in_RDI->encoded = local_40;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
      return in_RDI;
    }
  }
  in_RDI->encoded = -1;
  in_RDI->failed_type = in_RSI;
  in_RDI->structure_ptr = in_RDX;
  if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
    local_60 = "";
  }
  else {
    local_60 = in_RSI->name;
  }
  ASN_DEBUG("Failed to encode element %s",local_60);
  return in_RDI;
}

Assistant:

asn_enc_rval_t
BOOLEAN_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const BOOLEAN_t *st = (const BOOLEAN_t *)sptr;
	asn_enc_rval_t er;

	(void)ilevel;
	(void)flags;

	if(!st) ASN__ENCODE_FAILED;

	if(*st) {
		ASN__CALLBACK("<true/>", 7);
		er.encoded = 7;
	} else {
		ASN__CALLBACK("<false/>", 8);
		er.encoded = 8;
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}